

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_container_unit.c
# Opt level: O3

int run_negation_range_tests
              (int k,int h,int start_offset,int r_start,int r_end,int expected_type,_Bool inplace,
              _Bool expected_actual_inplace)

{
  byte bVar1;
  ushort uVar2;
  rle16_t *prVar3;
  uint8_t uVar4;
  int extraout_EAX;
  int extraout_EAX_00;
  run_container_t *src;
  run_container_t *prVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  uint8_t type;
  bool bVar11;
  int iVar12;
  uint uVar13;
  long lVar14;
  unsigned_long a;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  ushort uVar18;
  ulong uVar19;
  int iVar20;
  _Bool result_should_be [65536];
  run_container_t *prStack_10048;
  int iStack_10040;
  int iStack_1003c;
  byte abStack_10038 [65544];
  
  iVar20 = 0;
  iStack_10040 = expected_type;
  iStack_1003c = r_start;
  src = run_container_create_given_capacity((int)(0x10000 / (ulong)(uint)k) + 1);
  _assert_true((ulong)(h < k),"h < k",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
               ,0x62d);
  if (start_offset != 0x10000) {
    iVar6 = -start_offset;
    iVar12 = h;
    do {
      if (iVar20 % k == 0) {
        iVar7 = iVar12;
        if (0x10000 < start_offset + iVar20 + iVar12) {
          iVar7 = iVar6;
        }
        src->runs[src->n_runs] =
             (rle16_t)((start_offset + iVar20 & 0xffffU) + iVar7 * 0x10000 + -0x10000);
        src->n_runs = src->n_runs + 1;
        iVar12 = iVar12 + 1;
        if (iVar12 == k) {
          iVar12 = h;
        }
      }
      iVar20 = iVar20 + 1;
      iVar6 = iVar6 + -1;
    } while (iVar6 != -0x10000);
  }
  prVar3 = src->runs;
  iVar20 = src->n_runs;
  lVar10 = (long)iStack_1003c;
  lVar14 = 0;
  iVar12 = 0;
  do {
    if (iVar20 < 1) {
LAB_0010a45d:
      if (lVar14 < lVar10) goto LAB_0010a456;
LAB_0010a462:
      abStack_10038[lVar14] = 1;
      iVar12 = iVar12 + 1;
    }
    else {
      uVar19 = 0;
      iVar6 = iVar20 + -1;
      do {
        uVar17 = (uint)(iVar6 + (int)uVar19) >> 1;
        if (prVar3[uVar17].value < (ushort)lVar14) {
          uVar19 = (ulong)(uVar17 + 1);
        }
        else {
          if (prVar3[uVar17].value <= (ushort)lVar14) {
            if (lVar10 <= lVar14) goto LAB_0010a456;
            goto LAB_0010a462;
          }
          iVar6 = uVar17 - 1;
        }
      } while ((int)uVar19 <= iVar6);
      if ((int)uVar19 == 0) goto LAB_0010a45d;
      if ((int)(uint)prVar3[uVar19 - 1].length < (int)((int)lVar14 - (uint)prVar3[uVar19 - 1].value)
          != lVar14 < lVar10) goto LAB_0010a462;
LAB_0010a456:
      abStack_10038[lVar14] = 0;
    }
    lVar14 = lVar14 + 1;
  } while (lVar14 != 0x10000);
  if ((char)iStack_10040 == '\0') {
    uVar17 = run_container_negation_range(src,iStack_1003c,0x10000,&prStack_10048);
  }
  else {
    uVar17 = run_container_negation_range_inplace(src,iStack_1003c,0x10000,&prStack_10048);
  }
  type = (uint8_t)uVar17;
  prVar5 = prStack_10048;
  uVar4 = type;
  if (type == '\x04') {
    prVar5 = *(run_container_t **)prStack_10048;
    uVar4 = *(uint8_t *)&prStack_10048->runs;
  }
  if (uVar4 == '\x03') {
    iVar20 = run_container_cardinality(prVar5);
  }
  else if (uVar4 == '\x02') {
    iVar20 = prVar5->n_runs;
  }
  else {
    iVar20 = prVar5->n_runs;
  }
  _assert_int_equal((ulong)(uint)r_end,(long)(int)uVar17,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x653);
  _assert_true((ulong)((prStack_10048 != src) != inplace),"BO == RI",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
               ,(inplace ^ 1) * 2 + 0x656);
  _assert_int_equal((long)iVar12,(long)iVar20,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x65b);
  uVar19 = 0;
LAB_0010a548:
  prVar5 = prStack_10048;
  uVar8 = uVar17;
  if (type == '\x04') {
    uVar8 = (uint)*(byte *)&prStack_10048->runs;
    prVar5 = *(run_container_t **)prStack_10048;
  }
  prVar3 = prVar5->runs;
  uVar18 = (ushort)uVar19;
  if ((char)uVar8 == '\x03') {
    if (0 < prVar5->n_runs) {
      iVar20 = prVar5->n_runs + -1;
      uVar9 = 0;
      do {
        uVar8 = (uint)(iVar20 + (int)uVar9) >> 1;
        if (prVar3[uVar8].value < uVar18) {
          uVar9 = (ulong)(uVar8 + 1);
        }
        else {
          if (prVar3[uVar8].value <= uVar18) goto LAB_0010a63d;
          iVar20 = uVar8 - 1;
        }
      } while ((int)uVar9 <= iVar20);
      if (((int)uVar9 != 0) &&
         (bVar11 = true,
         (int)((int)uVar19 - (uint)prVar3[uVar9 - 1].value) <= (int)(uint)prVar3[uVar9 - 1].length))
      goto LAB_0010a640;
    }
LAB_0010a639:
    bVar11 = false;
  }
  else if ((uVar8 & 0xff) == 2) {
    uVar9 = 0;
    uVar8 = prVar5->n_runs;
    do {
      iVar20 = (int)uVar9 + 0x10;
      while( true ) {
        if ((int)uVar8 <= iVar20) {
          if ((int)uVar8 <= (int)uVar9) goto LAB_0010a639;
          goto LAB_0010a619;
        }
        uVar13 = (uVar8 - 1) + (int)uVar9;
        uVar16 = uVar13 >> 1;
        uVar2 = *(ushort *)((long)&prVar3->value + (ulong)(uVar13 & 0xfffffffe));
        if (uVar18 <= uVar2) break;
        uVar9 = (ulong)(uVar16 + 1);
        iVar20 = uVar16 + 0x11;
      }
      uVar8 = uVar16;
      bVar11 = true;
    } while (uVar18 < uVar2);
  }
  else {
    bVar11 = (*(ulong *)(prVar3 + (uVar19 >> 6 & 0x3ffffff) * 2) >> (uVar19 & 0x3f) & 1) != 0;
  }
  goto LAB_0010a640;
  while( true ) {
    bVar11 = false;
    if ((uVar18 < (&prVar3->value)[uVar9]) ||
       (iVar20 = (int)uVar9, uVar9 = uVar9 + 1, bVar11 = false, uVar8 - 1 == iVar20)) break;
LAB_0010a619:
    if ((&prVar3->value)[uVar9] == uVar18) goto LAB_0010a63d;
  }
LAB_0010a640:
  bVar1 = abStack_10038[uVar19];
  if ((bool)bVar1 != bVar11) {
    printf("problem at index %d should be (but isnt) %d\n",uVar19 & 0xffffffff,(ulong)(uint)bVar1);
  }
  prVar5 = prStack_10048;
  uVar8 = uVar17;
  if (type == '\x04') {
    prVar5 = *(run_container_t **)prStack_10048;
    uVar8 = (uint)*(byte *)&prStack_10048->runs;
  }
  prVar3 = prVar5->runs;
  if ((char)uVar8 == '\x03') {
    if (0 < prVar5->n_runs) {
      iVar20 = prVar5->n_runs + -1;
      uVar8 = 0;
      do {
        uVar13 = iVar20 + uVar8 >> 1;
        if (prVar3[uVar13].value < uVar18) {
          uVar8 = uVar13 + 1;
        }
        else {
          if (prVar3[uVar13].value <= uVar18) goto LAB_0010a74b;
          iVar20 = uVar13 - 1;
        }
      } while ((int)uVar8 <= iVar20);
      if ((uVar8 != 0) &&
         (a = 1, (int)((int)uVar19 - (uint)prVar3[(ulong)uVar8 - 1].value) <=
                 (int)(uint)prVar3[(ulong)uVar8 - 1].length)) goto LAB_0010a750;
    }
LAB_0010a747:
    a = 0;
  }
  else if ((uVar8 & 0xff) == 2) {
    uVar8 = 0;
    uVar13 = prVar5->n_runs;
    do {
      iVar20 = uVar8 + 0x10;
      while( true ) {
        if ((int)uVar13 <= iVar20) {
          if ((int)uVar13 <= (int)uVar8) goto LAB_0010a747;
          uVar9 = (ulong)uVar8;
          goto LAB_0010a729;
        }
        uVar16 = (uVar13 - 1) + uVar8;
        uVar15 = uVar16 >> 1;
        uVar2 = *(ushort *)((long)&prVar3->value + (ulong)(uVar16 & 0xfffffffe));
        if (uVar18 <= uVar2) break;
        uVar8 = uVar15 + 1;
        iVar20 = uVar15 + 0x11;
      }
      a = 1;
      uVar13 = uVar15;
    } while (uVar18 < uVar2);
  }
  else {
    a = (unsigned_long)
        ((*(ulong *)(prVar3 + (uVar19 >> 6 & 0x3ffffff) * 2) >> (uVar19 & 0x3f) & 1) != 0);
  }
LAB_0010a750:
  _assert_int_equal(a,(ulong)(uint)bVar1,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x665);
  uVar19 = uVar19 + 1;
  if (uVar19 == 0x10000) {
    container_free(prStack_10048,type);
    iVar20 = extraout_EAX;
    if ((char)iStack_10040 == '\0') {
      run_container_free(src);
      iVar20 = extraout_EAX_00;
    }
    return iVar20;
  }
  goto LAB_0010a548;
LAB_0010a63d:
  bVar11 = true;
  goto LAB_0010a640;
  while( true ) {
    if (uVar18 <= uVar2 && uVar2 != uVar18) goto LAB_0010a747;
    a = 0;
    iVar20 = (int)uVar9;
    uVar9 = uVar9 + 1;
    if (uVar13 - 1 == iVar20) break;
LAB_0010a729:
    uVar2 = (&prVar3->value)[uVar9];
    if (uVar2 == uVar18) goto LAB_0010a74b;
  }
  goto LAB_0010a750;
LAB_0010a74b:
  a = 1;
  goto LAB_0010a750;
}

Assistant:

static int run_negation_range_tests(int k, int h, int start_offset, int r_start,
                                    int r_end, int expected_type, bool inplace,
                                    bool expected_actual_inplace) {
    run_container_t* RI =
        run_container_create_given_capacity((1 << 16) / k + 1);
    container_t* BO;
    int returned_type;
    int result_size_should_be;
    bool result_should_be[1 << 16];

    assert_true(h <
                k);  // bad test call otherwise..not failure of code under test

    int runlen = h;
    for (int x = 0; x < (1 << 16) - start_offset; x++) {
        int offsetx = x + start_offset;
        if (x % k == 0) {
            int actual_runlen = runlen;
            if (offsetx + runlen > (1 << 16))
                actual_runlen = (1 << 16) - offsetx;

            // run_container_append does not dynamically increase its
            // array
            run_container_append_first(
                RI, CROARING_MAKE_RLE16(offsetx, actual_runlen - 1));
            if (++runlen == k) runlen = h;  // wrap after k-1 back to h.
        }
    }

    result_size_should_be = 0;

    for (int i = 0; i < (1 << 16); ++i) {
        bool in_zone = (i >= r_start && i < r_end);
        if (run_container_contains(RI, (uint16_t)i) ^ in_zone) {
            result_should_be[i] = true;
            ++result_size_should_be;
        } else
            result_should_be[i] = false;
    }
    if (inplace)
        returned_type =
            run_container_negation_range_inplace(RI, r_start, r_end, &BO);
    else
        returned_type = run_container_negation_range(RI, r_start, r_end, &BO);

    uint8_t result_typecode = (uint8_t)returned_type;

    int result_card = container_get_cardinality(BO, result_typecode);

    assert_int_equal(expected_type, returned_type);

    if (expected_actual_inplace) {
        assert_true(BO == RI);  // it really is inplace
    } else {
        assert_false(BO == RI);  // it better not be inplace
    }

    assert_int_equal(result_size_should_be, result_card);

    for (int x = 0; x < (1 << 16); x++) {
#ifndef UNVERBOSE_MIXED_CONTAINER
        if (container_contains(BO, (uint16_t)x, result_typecode) !=
            result_should_be[x])
            printf("problem at index %d should be (but isnt) %d\n", x,
                   (int)result_should_be[x]);
#endif
        assert_int_equal(container_contains(BO, (uint16_t)x, result_typecode),
                         result_should_be[x]);
    }
    // assert_int_equal(result_size_should_be, result_card);
    container_free(BO, result_typecode);
    if (!inplace) run_container_free(RI);
    // for inplace: input is either output, or it was already freed
    // internally

    return 1;
}